

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVector.cpp
# Opt level: O3

void __thiscall BVFixed::BVFixed(BVFixed *this,BVIndex length,bool initialSet)

{
  code *pcVar1;
  bool bVar2;
  BVIndex BVar3;
  undefined4 *puVar4;
  
  this->len = length;
  if (length == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/FixedBitVector.cpp"
                       ,0x10,"(length != 0)","length != 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  BVar3 = WordCount(this->len);
  if (initialSet) {
    memset(this + 1,0xff,(ulong)(BVar3 << 3));
    ClearEnd(this);
    return;
  }
  memset(this + 1,0,(ulong)(BVar3 << 3));
  return;
}

Assistant:

BVFixed::BVFixed(BVIndex length, bool initialSet) :
    len(length)
{
    Assert(length != 0);
    if (initialSet)
    {
        this->SetAll();
    }
    else
    {
        this->ClearAll();
    }
}